

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

int helicsDataBufferStringSize(HelicsDataBuffer data)

{
  DataType DVar1;
  Message *pMVar2;
  size_t sVar3;
  int iVar4;
  string v;
  string local_50;
  data_view local_30;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar2->data;
    if (pMVar2 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  if ((SmallBuffer *)data == (SmallBuffer *)0x0) {
    iVar4 = 0;
  }
  else {
    DVar1 = helics::detail::detectType(((SmallBuffer *)data)->heap);
    if (DVar1 == HELICS_UNKNOWN) {
      iVar4 = (int)((SmallBuffer *)data)->bufferSize;
    }
    else if (DVar1 == HELICS_CHAR) {
      iVar4 = 1;
    }
    else {
      if (DVar1 == HELICS_STRING) {
        sVar3 = helics::detail::getDataSize(((SmallBuffer *)data)->heap);
        iVar4 = (int)sVar3;
      }
      else {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_30.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
        local_30.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
        local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        DVar1 = helics::detail::detectType((byte *)local_30.dblock._M_str);
        helics::valueExtract(&local_30,DVar1,&local_50);
        if (local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_30.ref.
                     super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        iVar4 = (int)local_50._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
      }
      iVar4 = iVar4 + 1;
    }
  }
  return iVar4;
}

Assistant:

int helicsDataBufferStringSize(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    switch (helics::detail::detectType(ptr->data())) {
        case helics::DataType::HELICS_STRING:
            return static_cast<int>(helics::detail::getDataSize(ptr->data())) + 1;
        case helics::DataType::HELICS_CHAR:
            return 1;
        case helics::DataType::HELICS_UNKNOWN:
            return static_cast<int>(ptr->size());
        default: {
            std::string v;
            helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);
            return static_cast<int>(v.size()) + 1;
        } break;
    }
}